

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall OpenMesh::PolyConnectivity::triangulate(PolyConnectivity *this,FaceHandle _fh)

{
  BaseHandle _heh;
  VertexHandle _end_vh;
  BaseHandle _heh_00;
  HalfedgeHandle HVar1;
  BaseHandle BVar2;
  FaceHandle _fh_00;
  VertexHandle _start_vh;
  HalfedgeHandle _nheh;
  Face *pFVar3;
  Halfedge *pHVar4;
  
  _heh.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_fh);
  _end_vh = ArrayKernel::from_vertex_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
  _heh_00.idx_ = (int)ArrayKernel::next_halfedge_handle
                                (&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
  while( true ) {
    HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_)
    ;
    BVar2.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar1);
    if ((BaseHandle)BVar2.idx_ == _end_vh.super_BaseHandle.idx_) break;
    HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_)
    ;
    _fh_00 = ArrayKernel::new_face(&this->super_ArrayKernel);
    pFVar3 = ArrayKernel::face(&this->super_ArrayKernel,_fh_00);
    (pFVar3->halfedge_handle_).super_BaseHandle.idx_ = _heh.idx_;
    _start_vh = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_)
    ;
    _nheh = ArrayKernel::new_edge(&this->super_ArrayKernel,_start_vh,_end_vh);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_,(HalfedgeHandle)_heh_00.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_,_nheh);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_nheh,(HalfedgeHandle)_heh.idx_);
    pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
    (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
         (int)_fh_00.super_BaseHandle.idx_;
    pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_);
    (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
         (int)_fh_00.super_BaseHandle.idx_;
    pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh);
    (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
         (int)_fh_00.super_BaseHandle.idx_;
    _heh = (-((uint)_nheh.super_BaseHandle.idx_ & 1) | 1) + _nheh.super_BaseHandle.idx_;
    _heh_00 = HVar1.super_BaseHandle.idx_;
  }
  pFVar3 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
  (pFVar3->halfedge_handle_).super_BaseHandle.idx_ = _heh.idx_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_,(HalfedgeHandle)_heh_00.idx_);
  HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.idx_);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,HVar1,(HalfedgeHandle)_heh.idx_);
  pHVar4 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)_heh.idx_);
  (pHVar4->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh.super_BaseHandle.idx_;
  return;
}

Assistant:

void PolyConnectivity::triangulate(FaceHandle _fh)
{
  /*
    Split an arbitrary face into triangles by connecting
    each vertex of fh after its second to vh.

    - fh will remain valid (it will become one of the
      triangles)
    - the halfedge handles of the new triangles will
      point to the old halfedges
  */

  HalfedgeHandle base_heh(halfedge_handle(_fh));
  VertexHandle start_vh = from_vertex_handle(base_heh);
  HalfedgeHandle next_heh(next_halfedge_handle(base_heh));

  while (to_vertex_handle(next_halfedge_handle(next_heh)) != start_vh)
  {
    HalfedgeHandle next_next_heh(next_halfedge_handle(next_heh));

    FaceHandle new_fh = new_face();
    set_halfedge_handle(new_fh, base_heh);

    HalfedgeHandle new_heh = new_edge(to_vertex_handle(next_heh), start_vh);

    set_next_halfedge_handle(base_heh, next_heh);
    set_next_halfedge_handle(next_heh, new_heh);
    set_next_halfedge_handle(new_heh, base_heh);

    set_face_handle(base_heh, new_fh);
    set_face_handle(next_heh, new_fh);
    set_face_handle(new_heh,  new_fh);

    base_heh = opposite_halfedge_handle(new_heh);
    next_heh = next_next_heh;
  }
  set_halfedge_handle(_fh, base_heh);  //the last face takes the handle _fh

  set_next_halfedge_handle(base_heh, next_heh);
  set_next_halfedge_handle(next_halfedge_handle(next_heh), base_heh);

  set_face_handle(base_heh, _fh);
}